

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_repeatedConnection_Test::~Connection_repeatedConnection_Test
          (Connection_repeatedConnection_Test *this)

{
  Connection_repeatedConnection_Test *this_local;
  
  ~Connection_repeatedConnection_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Connection, repeatedConnection)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"connection\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr m = p->parseModel(in);

    const std::string expectedIssue = "Connection in model 'connection' between 'component1' and 'component2' is not unique.";

    EXPECT_EQ(size_t(1), p->errorCount());
    EXPECT_EQ(expectedIssue, p->error(0)->description());
}